

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O2

void __thiscall cubeb_init_destroy_stream_Test::TestBody(cubeb_init_destroy_stream_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  char *pcVar3;
  AssertHelper *this_00;
  AssertionResult *this_01;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_2;
  cubeb_stream *stream;
  cubeb *ctx;
  int r;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  this_01 = (AssertionResult *)local_68;
  r = common_init(&ctx,"test_sanity");
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&gtest_ar_2,in_RCX);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x9b;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,(void **)&gtest_ar_2);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0xac44000000;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
      actual = (anon_enum_32 *)0x0;
      r = cubeb_stream_init(ctx,&stream,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                            (cubeb_devid)0x0,(cubeb_stream_params *)&gtest_ar,0x113a,
                            test_data_callback,test_state_callback,&dummy);
      local_68 = (undefined1  [8])((ulong)(uint)local_68._4_4_ << 0x20);
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_2.success_,(char *)&r,(int *)local_68,actual);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)local_68);
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar2 = 0xa6;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        local_68 = (undefined1  [8])0x0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  ((internal *)&gtest_ar_2,"stream","nullptr",&stream,(void **)local_68);
        if (gtest_ar_2.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
          cubeb_stream_destroy(stream);
          cubeb_destroy(ctx);
          return;
        }
        testing::Message::Message((Message *)local_68);
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar2 = 0xa7;
      }
      this_00 = &local_20;
      pAVar1 = &gtest_ar_2;
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,iVar2,pcVar3);
      goto LAB_00108eb5;
    }
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x9c;
  }
  this_00 = (AssertHelper *)&stream;
  pAVar1 = &gtest_ar;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stream,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
             ,iVar2,pcVar3);
  this_01 = &gtest_ar_2;
LAB_00108eb5:
  testing::internal::AssertHelper::operator=(this_00,(Message *)this_01);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  return;
}

Assistant:

TEST(cubeb, init_destroy_stream)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_data_callback, test_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);
}